

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O3

TonkResult
tonk_advertise(TonkSocket tonkSocket,char *ipString,uint16_t port,void *data,uint32_t bytes)

{
  TonkResult TVar1;
  
  if (fp_tonk_advertise != (fp_tonk_advertise_t)0x0) {
    TVar1 = (*fp_tonk_advertise)(tonkSocket,ipString,port,data,bytes);
    return TVar1;
  }
  return Tonk_DLL_Not_Found;
}

Assistant:

TonkResult tonk_advertise(
    TonkSocket tonkSocket, ///< [in] Socket to send advertisement from
    const char*  ipString, ///< [in] Destination IP address
    uint16_t         port, ///< [in] Destination port
    const void*      data, ///< [in] Message data
    uint32_t        bytes  ///< [in] Message bytes
)
{
    if (!fp_tonk_advertise) {
        return Tonk_DLL_Not_Found;
    }

    return fp_tonk_advertise(
        tonkSocket,
        ipString,
        port,
        data,
        bytes);
}